

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  float fVar61;
  undefined1 auVar59 [32];
  undefined1 auVar60 [64];
  float fVar62;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  undefined1 auVar63 [64];
  float fVar70;
  float fVar71;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined1 auVar58 [16];
  undefined1 auVar72 [64];
  
  auVar60._4_60_ = in_register_00001204;
  auVar60._0_4_ = scale;
  fVar13 = scale * r_scale0;
  pBVar6 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.vertices.
           items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = pBVar6[itime].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[itime].super_RawBufferView.stride;
  lVar35 = (uVar5 + 1) * sVar8;
  lVar34 = (uVar5 + 2) * sVar8;
  lVar33 = (uVar5 + 3) * sVar8;
  aVar4 = ofs->field_0;
  auVar39 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + uVar5 * sVar8),(undefined1  [16])aVar4);
  auVar40 = vshufps_avx(auVar60._0_16_,auVar60._0_16_,0);
  fVar70 = auVar40._0_4_;
  auVar36._0_4_ = fVar70 * auVar39._0_4_;
  fVar73 = auVar40._4_4_;
  auVar36._4_4_ = fVar73 * auVar39._4_4_;
  fVar75 = auVar40._8_4_;
  auVar36._8_4_ = fVar75 * auVar39._8_4_;
  fVar77 = auVar40._12_4_;
  auVar36._12_4_ = fVar77 * auVar39._12_4_;
  auVar40 = vshufps_avx(auVar36,auVar36,0);
  auVar39 = vshufps_avx(auVar36,auVar36,0x55);
  auVar36 = vshufps_avx(auVar36,auVar36,0xaa);
  fVar16 = (space->vx).field_0.m128[0];
  fVar22 = (space->vx).field_0.m128[1];
  fVar23 = (space->vx).field_0.m128[2];
  fVar24 = (space->vx).field_0.m128[3];
  fVar71 = (space->vy).field_0.m128[0];
  fVar74 = (space->vy).field_0.m128[1];
  fVar76 = (space->vy).field_0.m128[2];
  fVar78 = (space->vy).field_0.m128[3];
  fVar25 = (space->vz).field_0.m128[0];
  fVar26 = (space->vz).field_0.m128[1];
  fVar27 = (space->vz).field_0.m128[2];
  fVar28 = (space->vz).field_0.m128[3];
  auVar44._0_4_ = auVar40._0_4_ * fVar16 + fVar71 * auVar39._0_4_ + fVar25 * auVar36._0_4_;
  auVar44._4_4_ = auVar40._4_4_ * fVar22 + fVar74 * auVar39._4_4_ + fVar26 * auVar36._4_4_;
  auVar44._8_4_ = auVar40._8_4_ * fVar23 + fVar76 * auVar39._8_4_ + fVar27 * auVar36._8_4_;
  auVar44._12_4_ = auVar40._12_4_ * fVar24 + fVar78 * auVar39._12_4_ + fVar28 * auVar36._12_4_;
  fVar3 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar14 = fVar13 * fVar3 * *(float *)(pcVar7 + uVar5 * sVar8 + 0xc);
  auVar40 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar35),(undefined1  [16])aVar4);
  auVar48._0_4_ = fVar70 * auVar40._0_4_;
  auVar48._4_4_ = fVar73 * auVar40._4_4_;
  auVar48._8_4_ = fVar75 * auVar40._8_4_;
  auVar48._12_4_ = fVar77 * auVar40._12_4_;
  auVar40 = vshufps_avx(auVar48,auVar48,0);
  auVar39 = vshufps_avx(auVar48,auVar48,0x55);
  auVar36 = vshufps_avx(auVar48,auVar48,0xaa);
  auVar52._0_4_ = auVar40._0_4_ * fVar16 + fVar71 * auVar39._0_4_ + fVar25 * auVar36._0_4_;
  auVar52._4_4_ = auVar40._4_4_ * fVar22 + fVar74 * auVar39._4_4_ + fVar26 * auVar36._4_4_;
  auVar52._8_4_ = auVar40._8_4_ * fVar23 + fVar76 * auVar39._8_4_ + fVar27 * auVar36._8_4_;
  auVar52._12_4_ = auVar40._12_4_ * fVar24 + fVar78 * auVar39._12_4_ + fVar28 * auVar36._12_4_;
  auVar40 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar34),(undefined1  [16])aVar4);
  auVar55._0_4_ = fVar70 * auVar40._0_4_;
  auVar55._4_4_ = fVar73 * auVar40._4_4_;
  auVar55._8_4_ = fVar75 * auVar40._8_4_;
  auVar55._12_4_ = fVar77 * auVar40._12_4_;
  auVar40 = vshufps_avx(auVar55,auVar55,0);
  auVar39 = vshufps_avx(auVar55,auVar55,0x55);
  auVar36 = vshufps_avx(auVar55,auVar55,0xaa);
  auVar58._0_4_ = auVar40._0_4_ * fVar16 + fVar71 * auVar39._0_4_ + fVar25 * auVar36._0_4_;
  auVar58._4_4_ = auVar40._4_4_ * fVar22 + fVar74 * auVar39._4_4_ + fVar26 * auVar36._4_4_;
  auVar58._8_4_ = auVar40._8_4_ * fVar23 + fVar76 * auVar39._8_4_ + fVar27 * auVar36._8_4_;
  auVar58._12_4_ = auVar40._12_4_ * fVar24 + fVar78 * auVar39._12_4_ + fVar28 * auVar36._12_4_;
  auVar60 = ZEXT1664(auVar58);
  fVar15 = fVar13 * fVar3 * *(float *)(pcVar7 + lVar34 + 0xc);
  auVar40 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar33),(undefined1  [16])aVar4);
  auVar38._0_4_ = fVar70 * auVar40._0_4_;
  auVar38._4_4_ = fVar73 * auVar40._4_4_;
  auVar38._8_4_ = fVar75 * auVar40._8_4_;
  auVar38._12_4_ = fVar77 * auVar40._12_4_;
  auVar40 = vshufps_avx(auVar38,auVar38,0);
  auVar39 = vshufps_avx(auVar38,auVar38,0x55);
  auVar36 = vshufps_avx(auVar38,auVar38,0xaa);
  fVar71 = fVar71 * auVar39._0_4_;
  fVar74 = fVar74 * auVar39._4_4_;
  fVar76 = fVar76 * auVar39._8_4_;
  fVar78 = fVar78 * auVar39._12_4_;
  auVar72 = ZEXT1664(CONCAT412(fVar78,CONCAT48(fVar76,CONCAT44(fVar74,fVar71))));
  auVar39._0_4_ = auVar40._0_4_ * fVar16 + fVar71 + fVar25 * auVar36._0_4_;
  auVar39._4_4_ = auVar40._4_4_ * fVar22 + fVar74 + fVar26 * auVar36._4_4_;
  auVar39._8_4_ = auVar40._8_4_ * fVar23 + fVar76 + fVar27 * auVar36._8_4_;
  auVar39._12_4_ = auVar40._12_4_ * fVar24 + fVar78 + fVar28 * auVar36._12_4_;
  fVar16 = fVar3 * *(float *)(pcVar7 + lVar33 + 0xc) * fVar13;
  uVar5 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
          tessellationRate;
  lVar33 = (long)(int)uVar5;
  auVar36 = ZEXT416((uint)(fVar13 * fVar3 * *(float *)(pcVar7 + lVar35 + 0xc)));
  auVar40 = ZEXT416((uint)fVar16);
  if (lVar33 == 4) {
    auVar38 = vshufps_avx(auVar39,auVar39,0);
    auVar48 = vshufps_avx(auVar39,auVar39,0x55);
    auVar55 = vshufps_avx(auVar39,auVar39,0xaa);
    auVar46 = vshufps_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16),0);
    auVar45 = vshufps_avx(auVar58,auVar58,0);
    auVar53 = vshufps_avx(auVar58,auVar58,0x55);
    auVar58 = vshufps_avx(auVar58,auVar58,0xaa);
    auVar37 = vshufps_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15),0);
    auVar56 = vshufps_avx(auVar52,auVar52,0);
    auVar43 = vshufps_avx(auVar52,auVar52,0x55);
    auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
    auVar19 = vshufps_avx(auVar44,auVar44,0);
    auVar36 = vshufps_avx(auVar36,auVar36,0);
    auVar20 = vshufps_avx(auVar44,auVar44,0x55);
    auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
    auVar21 = vshufps_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),0);
    auVar49._0_4_ =
         auVar56._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar45._0_4_ * (float)bezier_basis0._2584_4_ +
         auVar38._0_4_ * (float)bezier_basis0._3740_4_ +
         auVar19._0_4_ * (float)bezier_basis0._272_4_;
    auVar49._4_4_ =
         auVar56._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar45._4_4_ * (float)bezier_basis0._2588_4_ +
         auVar38._4_4_ * (float)bezier_basis0._3744_4_ +
         auVar19._4_4_ * (float)bezier_basis0._276_4_;
    auVar49._8_4_ =
         auVar56._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar45._8_4_ * (float)bezier_basis0._2592_4_ +
         auVar38._8_4_ * (float)bezier_basis0._3748_4_ +
         auVar19._8_4_ * (float)bezier_basis0._280_4_;
    auVar49._12_4_ =
         auVar56._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar45._12_4_ * (float)bezier_basis0._2596_4_ +
         auVar38._12_4_ * (float)bezier_basis0._3752_4_ +
         auVar19._12_4_ * (float)bezier_basis0._284_4_;
    auVar56._0_4_ =
         auVar43._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar53._0_4_ * (float)bezier_basis0._2584_4_ +
         auVar48._0_4_ * (float)bezier_basis0._3740_4_ +
         (float)bezier_basis0._272_4_ * auVar20._0_4_;
    auVar56._4_4_ =
         auVar43._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar53._4_4_ * (float)bezier_basis0._2588_4_ +
         auVar48._4_4_ * (float)bezier_basis0._3744_4_ +
         (float)bezier_basis0._276_4_ * auVar20._4_4_;
    auVar56._8_4_ =
         auVar43._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar53._8_4_ * (float)bezier_basis0._2592_4_ +
         auVar48._8_4_ * (float)bezier_basis0._3748_4_ +
         (float)bezier_basis0._280_4_ * auVar20._8_4_;
    auVar56._12_4_ =
         auVar43._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar53._12_4_ * (float)bezier_basis0._2596_4_ +
         auVar48._12_4_ * (float)bezier_basis0._3752_4_ +
         (float)bezier_basis0._284_4_ * auVar20._12_4_;
    auVar45._0_4_ =
         (float)bezier_basis0._272_4_ * auVar44._0_4_ +
         auVar58._0_4_ * (float)bezier_basis0._2584_4_ +
         auVar55._0_4_ * (float)bezier_basis0._3740_4_ +
         auVar52._0_4_ * (float)bezier_basis0._1428_4_;
    auVar45._4_4_ =
         (float)bezier_basis0._276_4_ * auVar44._4_4_ +
         auVar58._4_4_ * (float)bezier_basis0._2588_4_ +
         auVar55._4_4_ * (float)bezier_basis0._3744_4_ +
         auVar52._4_4_ * (float)bezier_basis0._1432_4_;
    auVar45._8_4_ =
         (float)bezier_basis0._280_4_ * auVar44._8_4_ +
         auVar58._8_4_ * (float)bezier_basis0._2592_4_ +
         auVar55._8_4_ * (float)bezier_basis0._3748_4_ +
         auVar52._8_4_ * (float)bezier_basis0._1436_4_;
    auVar45._12_4_ =
         (float)bezier_basis0._284_4_ * auVar44._12_4_ +
         auVar58._12_4_ * (float)bezier_basis0._2596_4_ +
         auVar55._12_4_ * (float)bezier_basis0._3752_4_ +
         auVar52._12_4_ * (float)bezier_basis0._1440_4_;
    auVar53._0_4_ =
         (float)bezier_basis0._272_4_ * auVar21._0_4_ +
         auVar36._0_4_ * (float)bezier_basis0._1428_4_ +
         auVar46._0_4_ * (float)bezier_basis0._3740_4_ +
         auVar37._0_4_ * (float)bezier_basis0._2584_4_;
    auVar53._4_4_ =
         (float)bezier_basis0._276_4_ * auVar21._4_4_ +
         auVar36._4_4_ * (float)bezier_basis0._1432_4_ +
         auVar46._4_4_ * (float)bezier_basis0._3744_4_ +
         auVar37._4_4_ * (float)bezier_basis0._2588_4_;
    auVar53._8_4_ =
         (float)bezier_basis0._280_4_ * auVar21._8_4_ +
         auVar36._8_4_ * (float)bezier_basis0._1436_4_ +
         auVar46._8_4_ * (float)bezier_basis0._3748_4_ +
         auVar37._8_4_ * (float)bezier_basis0._2592_4_;
    auVar53._12_4_ =
         (float)bezier_basis0._284_4_ * auVar21._12_4_ +
         auVar36._12_4_ * (float)bezier_basis0._1440_4_ +
         auVar46._12_4_ * (float)bezier_basis0._3752_4_ +
         auVar37._12_4_ * (float)bezier_basis0._2596_4_;
    auVar48 = vshufps_avx(auVar49,auVar49,0xb1);
    auVar36 = vminps_avx(auVar48,auVar49);
    auVar38 = vshufpd_avx(auVar36,auVar36,1);
    auVar36 = vminps_avx(auVar38,auVar36);
    auVar52 = vshufps_avx(auVar56,auVar56,0xb1);
    auVar38 = vminps_avx(auVar52,auVar56);
    auVar44 = vshufpd_avx(auVar38,auVar38,1);
    auVar38 = vminps_avx(auVar44,auVar38);
    auVar36 = vinsertps_avx(auVar36,auVar38,0x1c);
    auVar55 = vshufps_avx(auVar45,auVar45,0xb1);
    auVar38 = vminps_avx(auVar55,auVar45);
    auVar44 = vshufpd_avx(auVar38,auVar38,1);
    auVar38 = vminps_avx(auVar44,auVar38);
    auVar38 = vinsertps_avx(auVar36,auVar38,0x20);
    auVar36 = vmaxps_avx(auVar48,auVar49);
    auVar44 = vshufpd_avx(auVar36,auVar36,1);
    auVar36 = vmaxps_avx(auVar44,auVar36);
    auVar44 = vmaxps_avx(auVar52,auVar56);
    auVar48 = vshufpd_avx(auVar44,auVar44,1);
    auVar44 = vmaxps_avx(auVar48,auVar44);
    auVar36 = vinsertps_avx(auVar36,auVar44,0x1c);
    auVar44 = vmaxps_avx(auVar55,auVar45);
    auVar48 = vshufpd_avx(auVar44,auVar44,1);
    auVar44 = vmaxps_avx(auVar48,auVar44);
    auVar36 = vinsertps_avx(auVar36,auVar44,0x20);
    auVar46._8_4_ = 0x7fffffff;
    auVar46._0_8_ = 0x7fffffff7fffffff;
    auVar46._12_4_ = 0x7fffffff;
    auVar44 = vandps_avx(auVar53,auVar46);
    auVar48 = vshufps_avx(auVar44,auVar44,0xb1);
    auVar44 = vmaxps_avx(auVar48,auVar44);
    auVar48 = vshufps_avx(auVar44,auVar44,0);
    auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
    auVar44 = vmaxps_avx(auVar44,auVar48);
  }
  else {
    auVar38 = vpshufd_avx(ZEXT416(uVar5),0);
    auVar48 = vshufps_avx(auVar44,auVar44,0);
    auVar55 = vshufps_avx(auVar44,auVar44,0x55);
    auVar63 = ZEXT1664(auVar55);
    auVar44 = vshufps_avx(auVar44,auVar44,0xaa);
    auVar46 = vshufps_avx(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14),0);
    auVar45 = vshufps_avx(auVar52,auVar52,0);
    auVar53 = vshufps_avx(auVar52,auVar52,0x55);
    auVar52 = vshufps_avx(auVar52,auVar52,0xaa);
    auVar36 = vshufps_avx(auVar36,auVar36,0);
    auVar37 = vshufps_avx(auVar58,auVar58,0);
    auVar56 = vshufps_avx(auVar58,auVar58,0x55);
    auVar58 = vshufps_avx(auVar58,auVar58,0xaa);
    auVar43 = vshufps_avx(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15),0);
    auVar19 = vshufps_avx(auVar39,auVar39,0);
    auVar20 = vshufps_avx(auVar39,auVar39,0x55);
    auVar21 = vshufps_avx(auVar39,auVar39,0xaa);
    auVar49 = vshufps_avx(auVar40,auVar40,0);
    lVar34 = lVar33 * 0x44;
    auVar79._8_4_ = 0x7f800000;
    auVar79._0_8_ = 0x7f8000007f800000;
    auVar79._12_4_ = 0x7f800000;
    auVar79._16_4_ = 0x7f800000;
    auVar79._20_4_ = 0x7f800000;
    auVar79._24_4_ = 0x7f800000;
    auVar79._28_4_ = 0x7f800000;
    auVar80._8_4_ = 0xff800000;
    auVar80._0_8_ = 0xff800000ff800000;
    auVar80._12_4_ = 0xff800000;
    auVar80._16_4_ = 0xff800000;
    auVar80._20_4_ = 0xff800000;
    auVar80._24_4_ = 0xff800000;
    auVar80._28_4_ = 0xff800000;
    auVar51 = ZEXT864(0);
    auVar12 = auVar80;
    auVar9 = auVar79;
    auVar10 = auVar79;
    auVar11 = auVar80;
    for (lVar35 = 0; auVar50 = auVar51._0_32_, lVar35 < lVar33; lVar35 = lVar35 + 8) {
      auVar18 = vpshufd_avx(ZEXT416((uint)lVar35),0);
      auVar17 = vpor_avx(auVar18,_DAT_01f4ad30);
      auVar18 = vpor_avx(auVar18,_DAT_01f7afa0);
      auVar17 = vpcmpgtd_avx(auVar38,auVar17);
      auVar17 = vpackssdw_avx(auVar17,auVar17);
      auVar18 = vpcmpgtd_avx(auVar38,auVar18);
      auVar17 = vpunpcklwd_avx(auVar17,auVar17);
      auVar47._16_16_ = auVar18;
      auVar47._0_16_ = auVar17;
      pfVar1 = (float *)(lVar34 + 0x21fbbec + lVar35 * 4);
      fVar13 = *pfVar1;
      fVar14 = pfVar1[1];
      fVar15 = pfVar1[2];
      fVar16 = pfVar1[3];
      fVar22 = pfVar1[4];
      fVar23 = pfVar1[5];
      fVar24 = pfVar1[6];
      pfVar2 = (float *)(lVar34 + 0x21fc070 + lVar35 * 4);
      fVar71 = *pfVar2;
      fVar74 = pfVar2[1];
      fVar76 = pfVar2[2];
      fVar78 = pfVar2[3];
      fVar25 = pfVar2[4];
      fVar26 = pfVar2[5];
      fVar27 = pfVar2[6];
      fVar28 = pfVar2[7];
      local_1a8 = auVar19._0_4_;
      fStack_1a4 = auVar19._4_4_;
      fStack_1a0 = auVar19._8_4_;
      fStack_19c = auVar19._12_4_;
      local_1c8 = auVar20._0_4_;
      fStack_1c4 = auVar20._4_4_;
      fStack_1c0 = auVar20._8_4_;
      fStack_1bc = auVar20._12_4_;
      local_1e8 = auVar21._0_4_;
      fStack_1e4 = auVar21._4_4_;
      fStack_1e0 = auVar21._8_4_;
      fStack_1dc = auVar21._12_4_;
      local_128 = auVar37._0_4_;
      fStack_124 = auVar37._4_4_;
      fStack_120 = auVar37._8_4_;
      fStack_11c = auVar37._12_4_;
      local_148 = auVar56._0_4_;
      fStack_144 = auVar56._4_4_;
      fStack_140 = auVar56._8_4_;
      fStack_13c = auVar56._12_4_;
      fVar3 = auVar63._28_4_;
      fVar61 = auVar60._28_4_ + fVar3;
      local_168 = auVar58._0_4_;
      fStack_164 = auVar58._4_4_;
      fStack_160 = auVar58._8_4_;
      fStack_15c = auVar58._12_4_;
      pfVar2 = (float *)(lVar34 + 0x21fb768 + lVar35 * 4);
      fVar70 = *pfVar2;
      fVar73 = pfVar2[1];
      fVar75 = pfVar2[2];
      fVar77 = pfVar2[3];
      fVar29 = pfVar2[4];
      fVar30 = pfVar2[5];
      fVar31 = pfVar2[6];
      fVar32 = pfVar2[7];
      local_208 = auVar49._0_4_;
      fStack_204 = auVar49._4_4_;
      fStack_200 = auVar49._8_4_;
      fStack_1fc = auVar49._12_4_;
      local_188 = auVar43._0_4_;
      fStack_184 = auVar43._4_4_;
      fStack_180 = auVar43._8_4_;
      fStack_17c = auVar43._12_4_;
      local_a8 = auVar45._0_4_;
      fStack_a4 = auVar45._4_4_;
      fStack_a0 = auVar45._8_4_;
      fStack_9c = auVar45._12_4_;
      local_c8 = auVar53._0_4_;
      fStack_c4 = auVar53._4_4_;
      fStack_c0 = auVar53._8_4_;
      fStack_bc = auVar53._12_4_;
      local_e8 = auVar52._0_4_;
      fStack_e4 = auVar52._4_4_;
      fStack_e0 = auVar52._8_4_;
      fStack_dc = auVar52._12_4_;
      auVar54 = *(undefined1 (*) [32])(bezier_basis0 + lVar35 * 4 + lVar34);
      auVar63 = ZEXT3264(auVar54);
      local_108 = auVar36._0_4_;
      fStack_104 = auVar36._4_4_;
      fStack_100 = auVar36._8_4_;
      fStack_fc = auVar36._12_4_;
      local_28 = auVar48._0_4_;
      fStack_24 = auVar48._4_4_;
      fStack_20 = auVar48._8_4_;
      fStack_1c = auVar48._12_4_;
      fVar62 = auVar54._0_4_;
      fVar64 = auVar54._4_4_;
      fVar65 = auVar54._8_4_;
      fVar66 = auVar54._12_4_;
      fVar67 = auVar54._16_4_;
      fVar68 = auVar54._20_4_;
      fVar69 = auVar54._24_4_;
      auVar41._0_4_ =
           fVar62 * local_28 + fVar70 * local_a8 + fVar71 * local_1a8 + fVar13 * local_128;
      auVar41._4_4_ =
           fVar64 * fStack_24 + fVar73 * fStack_a4 + fVar74 * fStack_1a4 + fVar14 * fStack_124;
      auVar41._8_4_ =
           fVar65 * fStack_20 + fVar75 * fStack_a0 + fVar76 * fStack_1a0 + fVar15 * fStack_120;
      auVar41._12_4_ =
           fVar66 * fStack_1c + fVar77 * fStack_9c + fVar78 * fStack_19c + fVar16 * fStack_11c;
      auVar41._16_4_ =
           fVar67 * local_28 + fVar29 * local_a8 + fVar25 * local_1a8 + fVar22 * local_128;
      auVar41._20_4_ =
           fVar68 * fStack_24 + fVar30 * fStack_a4 + fVar26 * fStack_1a4 + fVar23 * fStack_124;
      auVar41._24_4_ =
           fVar69 * fStack_20 + fVar31 * fStack_a0 + fVar27 * fStack_1a0 + fVar24 * fStack_120;
      auVar41._28_4_ = fVar32 + fVar28 + auVar60._28_4_ + 0.0;
      local_48 = auVar55._0_4_;
      fStack_44 = auVar55._4_4_;
      fStack_40 = auVar55._8_4_;
      fStack_3c = auVar55._12_4_;
      auVar57._0_4_ =
           fVar62 * local_48 + fVar13 * local_148 + fVar71 * local_1c8 + fVar70 * local_c8;
      auVar57._4_4_ =
           fVar64 * fStack_44 + fVar14 * fStack_144 + fVar74 * fStack_1c4 + fVar73 * fStack_c4;
      auVar57._8_4_ =
           fVar65 * fStack_40 + fVar15 * fStack_140 + fVar76 * fStack_1c0 + fVar75 * fStack_c0;
      auVar57._12_4_ =
           fVar66 * fStack_3c + fVar16 * fStack_13c + fVar78 * fStack_1bc + fVar77 * fStack_bc;
      auVar57._16_4_ =
           fVar67 * local_48 + fVar22 * local_148 + fVar25 * local_1c8 + fVar29 * local_c8;
      auVar57._20_4_ =
           fVar68 * fStack_44 + fVar23 * fStack_144 + fVar26 * fStack_1c4 + fVar30 * fStack_c4;
      auVar57._24_4_ =
           fVar69 * fStack_40 + fVar24 * fStack_140 + fVar27 * fStack_1c0 + fVar31 * fStack_c0;
      auVar57._28_4_ = fVar32 + fVar61 + fVar28;
      auVar54 = vminps_avx(auVar9,auVar41);
      auVar9 = vblendvps_avx(auVar9,auVar54,auVar47);
      auVar54 = vminps_avx(auVar79,auVar57);
      auVar79 = vblendvps_avx(auVar79,auVar54,auVar47);
      local_68 = auVar44._0_4_;
      fStack_64 = auVar44._4_4_;
      fStack_60 = auVar44._8_4_;
      fStack_5c = auVar44._12_4_;
      auVar59._0_4_ =
           fVar62 * local_68 + fVar70 * local_e8 + fVar13 * local_168 + fVar71 * local_1e8;
      auVar59._4_4_ =
           fVar64 * fStack_64 + fVar73 * fStack_e4 + fVar14 * fStack_164 + fVar74 * fStack_1e4;
      auVar59._8_4_ =
           fVar65 * fStack_60 + fVar75 * fStack_e0 + fVar15 * fStack_160 + fVar76 * fStack_1e0;
      auVar59._12_4_ =
           fVar66 * fStack_5c + fVar77 * fStack_dc + fVar16 * fStack_15c + fVar78 * fStack_1dc;
      auVar59._16_4_ =
           fVar67 * local_68 + fVar29 * local_e8 + fVar22 * local_168 + fVar25 * local_1e8;
      auVar59._20_4_ =
           fVar68 * fStack_64 + fVar30 * fStack_e4 + fVar23 * fStack_164 + fVar26 * fStack_1e4;
      auVar59._24_4_ =
           fVar69 * fStack_60 + fVar31 * fStack_e0 + fVar24 * fStack_160 + fVar27 * fStack_1e0;
      auVar59._28_4_ = auVar54._28_4_ + fVar61 + fVar3 + auVar72._28_4_;
      auVar60 = ZEXT3264(auVar59);
      auVar54 = vminps_avx(auVar10,auVar59);
      auVar72 = ZEXT3264(auVar54);
      auVar10 = vblendvps_avx(auVar10,auVar54,auVar47);
      auVar54 = vmaxps_avx(auVar11,auVar41);
      auVar11 = vblendvps_avx(auVar11,auVar54,auVar47);
      local_88 = auVar46._0_4_;
      fStack_84 = auVar46._4_4_;
      fStack_80 = auVar46._8_4_;
      fStack_7c = auVar46._12_4_;
      auVar42._0_4_ =
           fVar62 * local_88 + fVar70 * local_108 + fVar13 * local_188 + fVar71 * local_208;
      auVar42._4_4_ =
           fVar64 * fStack_84 + fVar73 * fStack_104 + fVar14 * fStack_184 + fVar74 * fStack_204;
      auVar42._8_4_ =
           fVar65 * fStack_80 + fVar75 * fStack_100 + fVar15 * fStack_180 + fVar76 * fStack_200;
      auVar42._12_4_ =
           fVar66 * fStack_7c + fVar77 * fStack_fc + fVar16 * fStack_17c + fVar78 * fStack_1fc;
      auVar42._16_4_ =
           fVar67 * local_88 + fVar29 * local_108 + fVar22 * local_188 + fVar25 * local_208;
      auVar42._20_4_ =
           fVar68 * fStack_84 + fVar30 * fStack_104 + fVar23 * fStack_184 + fVar26 * fStack_204;
      auVar42._24_4_ =
           fVar69 * fStack_80 + fVar31 * fStack_100 + fVar24 * fStack_180 + fVar27 * fStack_200;
      auVar42._28_4_ = auVar54._28_4_ + fVar32 + pfVar1[7] + fVar28;
      auVar54 = vmaxps_avx(auVar80,auVar57);
      auVar80 = vblendvps_avx(auVar80,auVar54,auVar47);
      auVar54 = vmaxps_avx(auVar12,auVar59);
      auVar12 = vblendvps_avx(auVar12,auVar54,auVar47);
      auVar54._8_4_ = 0x7fffffff;
      auVar54._0_8_ = 0x7fffffff7fffffff;
      auVar54._12_4_ = 0x7fffffff;
      auVar54._16_4_ = 0x7fffffff;
      auVar54._20_4_ = 0x7fffffff;
      auVar54._24_4_ = 0x7fffffff;
      auVar54._28_4_ = 0x7fffffff;
      auVar54 = vandps_avx(auVar42,auVar54);
      auVar54 = vmaxps_avx(auVar50,auVar54);
      auVar50 = vblendvps_avx(auVar50,auVar54,auVar47);
      auVar51 = ZEXT3264(auVar50);
    }
    auVar54 = vshufps_avx(auVar9,auVar9,0xb1);
    auVar9 = vminps_avx(auVar9,auVar54);
    auVar54 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar54);
    auVar36 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar9 = vshufps_avx(auVar79,auVar79,0xb1);
    auVar9 = vminps_avx(auVar79,auVar9);
    auVar79 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar79);
    auVar38 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar38 = vunpcklps_avx(auVar36,auVar38);
    auVar9 = vshufps_avx(auVar10,auVar10,0xb1);
    auVar9 = vminps_avx(auVar10,auVar9);
    auVar79 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vminps_avx(auVar9,auVar79);
    auVar36 = vminps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar38 = vinsertps_avx(auVar38,auVar36,0x28);
    auVar9 = vshufps_avx(auVar11,auVar11,0xb1);
    auVar9 = vmaxps_avx(auVar11,auVar9);
    auVar79 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar79);
    auVar36 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar9 = vshufps_avx(auVar80,auVar80,0xb1);
    auVar9 = vmaxps_avx(auVar80,auVar9);
    auVar79 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar79);
    auVar44 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar44 = vunpcklps_avx(auVar36,auVar44);
    auVar9 = vshufps_avx(auVar12,auVar12,0xb1);
    auVar9 = vmaxps_avx(auVar12,auVar9);
    auVar79 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar79);
    auVar36 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar36 = vinsertps_avx(auVar44,auVar36,0x28);
    auVar9 = vshufps_avx(auVar50,auVar50,0xb1);
    auVar9 = vmaxps_avx(auVar50,auVar9);
    auVar79 = vshufpd_avx(auVar9,auVar9,5);
    auVar9 = vmaxps_avx(auVar9,auVar79);
    auVar44 = vmaxps_avx(auVar9._0_16_,auVar9._16_16_);
    auVar44 = vshufps_avx(auVar44,auVar44,0);
  }
  auVar39 = vinsertps_avx(auVar39,auVar40,0x30);
  auVar38 = vminps_avx(auVar38,auVar39);
  auVar39 = vmaxps_avx(auVar36,auVar39);
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  auVar43._8_4_ = 0x7fffffff;
  auVar43._0_8_ = 0x7fffffff7fffffff;
  auVar43._12_4_ = 0x7fffffff;
  auVar40 = vandps_avx(auVar40,auVar43);
  auVar40 = vmaxps_avx(auVar44,auVar40);
  auVar36 = vsubps_avx(auVar38,auVar40);
  auVar37._0_4_ = auVar39._0_4_ + auVar40._0_4_;
  auVar37._4_4_ = auVar39._4_4_ + auVar40._4_4_;
  auVar37._8_4_ = auVar39._8_4_ + auVar40._8_4_;
  auVar37._12_4_ = auVar39._12_4_ + auVar40._12_4_;
  auVar40 = vandps_avx(auVar36,auVar43);
  auVar39 = vandps_avx(auVar37,auVar43);
  auVar40 = vmaxps_avx(auVar40,auVar39);
  auVar39 = vmovshdup_avx(auVar40);
  auVar39 = vmaxss_avx(auVar39,auVar40);
  auVar40 = vshufpd_avx(auVar40,auVar40,1);
  auVar40 = vmaxss_avx(auVar40,auVar39);
  auVar40 = ZEXT416((uint)(auVar40._0_4_ * 4.7683716e-07));
  auVar40 = vshufps_avx(auVar40,auVar40,0);
  aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar36,auVar40);
  (__return_storage_ptr__->lower).field_0 = aVar4;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar37._0_4_ + auVar40._0_4_;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar37._4_4_ + auVar40._4_4_;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar37._8_4_ + auVar40._8_4_;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar37._12_4_ + auVar40._12_4_;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }